

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int av1_rc_drop_frame(AV1_COMP *cpi)

{
  AV1_PRIMARY *pAVar1;
  int64_t buffer_level_00;
  _Bool _Var2;
  AV1_COMP *in_RDI;
  _Bool buffer_below_thresh;
  int drop_mark;
  SVC *svc;
  int64_t buffer_level;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1EncoderConfig *oxcf;
  int local_4;
  
  pAVar1 = in_RDI->ppi;
  buffer_level_00 = (pAVar1->p_rc).buffer_level;
  if (((in_RDI->common).current_frame.frame_type == '\0') ||
     ((((in_RDI->ppi->use_svc != 0 &&
        ((in_RDI->svc).layer_context[(in_RDI->svc).temporal_layer_id].is_key_frame != 0)) ||
       ((in_RDI->oxcf).rc_cfg.drop_frames_water_mark == 0)) ||
      ((0 < (in_RDI->rc).max_consec_drop &&
       ((in_RDI->rc).max_consec_drop <= (in_RDI->rc).drop_count_consec)))))) {
    local_4 = 0;
  }
  else if (((in_RDI->ppi->use_svc == 0) || ((in_RDI->svc).spatial_layer_id < 1)) ||
          ((((in_RDI->svc).drop_spatial_layer[(in_RDI->svc).spatial_layer_id + -1] & 1U) == 0 ||
           ((in_RDI->svc).framedrop_mode != AOM_FULL_SUPERFRAME_DROP)))) {
    _Var2 = check_buffer_below_thresh(in_RDI,buffer_level_00,-1);
    if (_Var2) {
      (in_RDI->rc).drop_count_consec = (in_RDI->rc).drop_count_consec + 1;
      local_4 = 1;
    }
    else {
      _Var2 = check_buffer_below_thresh
                        (in_RDI,buffer_level_00,
                         (int)(((long)(in_RDI->oxcf).rc_cfg.drop_frames_water_mark *
                               (pAVar1->p_rc).optimal_buffer_level) / 100));
      if ((_Var2) || ((in_RDI->rc).decimation_factor < 1)) {
        if ((_Var2) && ((in_RDI->rc).decimation_factor == 0)) {
          (in_RDI->rc).decimation_factor = 1;
        }
      }
      else {
        (in_RDI->rc).decimation_factor = (in_RDI->rc).decimation_factor + -1;
      }
      if ((in_RDI->rc).decimation_factor < 1) {
        (in_RDI->rc).decimation_count = 0;
        local_4 = 0;
      }
      else if ((in_RDI->rc).decimation_count < 1) {
        (in_RDI->rc).decimation_count = (in_RDI->rc).decimation_factor;
        local_4 = 0;
      }
      else {
        (in_RDI->rc).decimation_count = (in_RDI->rc).decimation_count + -1;
        (in_RDI->rc).drop_count_consec = (in_RDI->rc).drop_count_consec + 1;
        local_4 = 1;
      }
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int av1_rc_drop_frame(AV1_COMP *cpi) {
  const AV1EncoderConfig *oxcf = &cpi->oxcf;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
#if CONFIG_FPMT_TEST
  const int simulate_parallel_frame =
      cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0 &&
      cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE;
  int64_t buffer_level =
      simulate_parallel_frame ? p_rc->temp_buffer_level : p_rc->buffer_level;
#else
  int64_t buffer_level = p_rc->buffer_level;
#endif
  // Never drop on key frame, or for frame whose base layer is key.
  // If drop_count_consec hits or exceeds max_consec_drop then don't drop.
  if (cpi->common.current_frame.frame_type == KEY_FRAME ||
      (cpi->ppi->use_svc &&
       cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame) ||
      !oxcf->rc_cfg.drop_frames_water_mark ||
      (rc->max_consec_drop > 0 &&
       rc->drop_count_consec >= rc->max_consec_drop)) {
    return 0;
  } else {
    SVC *svc = &cpi->svc;
    // In the full_superframe framedrop mode for svc, if the previous spatial
    // layer was dropped, drop the current spatial layer.
    if (cpi->ppi->use_svc && svc->spatial_layer_id > 0 &&
        svc->drop_spatial_layer[svc->spatial_layer_id - 1] &&
        svc->framedrop_mode == AOM_FULL_SUPERFRAME_DROP)
      return 1;
    // -1 is passed here for drop_mark since we are checking if
    // buffer goes below 0 (<= -1).
    if (check_buffer_below_thresh(cpi, buffer_level, -1)) {
      // Always drop if buffer is below 0.
      rc->drop_count_consec++;
      return 1;
    } else {
      // If buffer is below drop_mark, for now just drop every other frame
      // (starting with the next frame) until it increases back over drop_mark.
      const int drop_mark = (int)(oxcf->rc_cfg.drop_frames_water_mark *
                                  p_rc->optimal_buffer_level / 100);
      const bool buffer_below_thresh =
          check_buffer_below_thresh(cpi, buffer_level, drop_mark);
      if (!buffer_below_thresh && rc->decimation_factor > 0) {
        --rc->decimation_factor;
      } else if (buffer_below_thresh && rc->decimation_factor == 0) {
        rc->decimation_factor = 1;
      }
      if (rc->decimation_factor > 0) {
        if (rc->decimation_count > 0) {
          --rc->decimation_count;
          rc->drop_count_consec++;
          return 1;
        } else {
          rc->decimation_count = rc->decimation_factor;
          return 0;
        }
      } else {
        rc->decimation_count = 0;
        return 0;
      }
    }
  }
}